

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O1

JavascriptPromiseCapability *
Js::JavascriptPromiseCapability::New
          (Var promise,Var resolve,Var reject,ScriptContext *scriptContext)

{
  Recycler *alloc;
  JavascriptPromiseCapability *this;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  local_50 = (undefined1  [8])&typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_7bb7f26;
  data.filename._0_4_ = 0x801;
  alloc = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_50);
  this = (JavascriptPromiseCapability *)new<Memory::Recycler>(0x20,alloc,0x38bbb2);
  JavascriptPromiseCapability(this,promise,resolve,reject);
  return this;
}

Assistant:

JavascriptPromiseCapability* JavascriptPromiseCapability::New(Var promise, Var resolve, Var reject, ScriptContext* scriptContext)
    {
        return RecyclerNew(scriptContext->GetRecycler(), JavascriptPromiseCapability, promise, resolve, reject);
    }